

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O0

int memfile_close(FILE *file,char **buffer,size_t *size)

{
  long lVar1;
  int *piVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  char *local_40;
  char *b;
  size_t s;
  int rc;
  size_t *size_local;
  char **buffer_local;
  FILE *file_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  b = (char *)ftell((FILE *)file);
  local_40 = (char *)malloc((size_t)(b + 1));
  if (local_40 == (char *)0x0) {
    s._4_4_ = -1;
    piVar2 = __errno_location();
    *piVar2 = 0xc;
    b = (char *)0x0;
  }
  else {
    rewind((FILE *)file);
    sVar3 = fread(local_40,(size_t)b,1,(FILE *)file);
    if (sVar3 == 1) {
      s._4_4_ = 0;
      local_40[(long)b] = '\0';
    }
    else {
      s._4_4_ = -1;
      free(local_40);
      local_40 = (char *)0x0;
      b = (char *)0x0;
    }
  }
  *buffer = local_40;
  *size = (size_t)b;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return s._4_4_;
}

Assistant:

static int memfile_close(FILE *file, char **buffer, size_t *size)
{
	int rc;
	size_t s;
	char *b;

	s = (size_t)ftell(file);
	b = malloc(s + 1);
	if (b == NULL) {
		rc = MUSTACH_ERROR_SYSTEM;
		errno = ENOMEM;
		s = 0;
	} else {
		rewind(file);
		if (1 == fread(b, s, 1, file)) {
			rc = 0;
			b[s] = 0;
		} else {
			rc = MUSTACH_ERROR_SYSTEM;
			free(b);
			b = NULL;
			s = 0;
		}
	}
	*buffer = b;
	*size = s;
	return rc;
}